

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O0

void ReadImage(gdImagePtr im,gdIOCtx *fd,int len,int height,uchar (*cmap) [256],int interlace,
              int *ZeroDataBlockP)

{
  int iVar1;
  undefined1 auStack_101a0 [8];
  LZW_STATIC_DATA sd;
  int local_40;
  int i;
  int v;
  int pass;
  int ypos;
  int xpos;
  uchar c;
  uchar (*pauStack_28) [256];
  int interlace_local;
  uchar (*cmap_local) [256];
  int height_local;
  int len_local;
  gdIOCtx *fd_local;
  gdImagePtr im_local;
  
  pass = 0;
  v = 0;
  i = 0;
  xpos = interlace;
  pauStack_28 = cmap;
  cmap_local._0_4_ = height;
  cmap_local._4_4_ = len;
  _height_local = fd;
  fd_local = (gdIOCtx *)im;
  iVar1 = gdGetBuf((void *)((long)&ypos + 3),1,fd);
  if ((0 < iVar1) && (ypos._3_1_ < 0xd)) {
    for (sd.scd.last_byte = 0; sd.scd.last_byte < 0x100; sd.scd.last_byte = sd.scd.last_byte + 1) {
      *(uint *)((long)&fd_local->putC + (long)sd.scd.last_byte * 4 + 4) =
           (uint)(*pauStack_28)[sd.scd.last_byte];
      *(uint *)((long)&fd_local[0x10].putC + (long)sd.scd.last_byte * 4 + 4) =
           (uint)pauStack_28[1][sd.scd.last_byte];
      *(uint *)((long)&fd_local[0x20].putC + (long)sd.scd.last_byte * 4 + 4) =
           (uint)pauStack_28[2][sd.scd.last_byte];
      *(undefined4 *)((long)&fd_local[0x30].putC + (long)sd.scd.last_byte * 4 + 4) = 1;
    }
    *(undefined4 *)&fd_local->putC = 0x100;
    iVar1 = LWZReadByte(_height_local,(LZW_STATIC_DATA *)auStack_101a0,'\x01',(uint)ypos._3_1_,
                        ZeroDataBlockP);
    if (-1 < iVar1) {
      do {
        local_40 = LWZReadByte(_height_local,(LZW_STATIC_DATA *)auStack_101a0,'\0',(uint)ypos._3_1_,
                               ZeroDataBlockP);
        if (local_40 < 0) break;
        if (0xff < local_40) {
          local_40 = 0;
        }
        if (*(int *)((long)&fd_local[0x30].putC + (long)local_40 * 4 + 4) != 0) {
          *(undefined4 *)((long)&fd_local[0x30].putC + (long)local_40 * 4 + 4) = 0;
        }
        gdImageSetPixel((gdImagePtr)fd_local,pass,v,local_40);
        pass = pass + 1;
        if (pass == cmap_local._4_4_) {
          pass = 0;
          if (xpos == 0) {
            v = v + 1;
          }
          else {
            if ((uint)i < 2) {
              v = v + 8;
            }
            else if (i == 2) {
              v = v + 4;
            }
            else if (i == 3) {
              v = v + 2;
            }
            if ((int)cmap_local <= v) {
              i = i + 1;
              if (i == 1) {
                v = 4;
              }
              else if (i == 2) {
                v = 2;
              }
              else {
                if (i != 3) break;
                v = 1;
              }
            }
          }
        }
      } while (v < (int)cmap_local);
      LWZReadByte(_height_local,(LZW_STATIC_DATA *)auStack_101a0,'\0',(uint)ypos._3_1_,
                  ZeroDataBlockP);
    }
  }
  return;
}

Assistant:

static void
ReadImage(gdImagePtr im, gdIOCtx *fd, int len, int height, unsigned char (*cmap)[256], int interlace, int *ZeroDataBlockP) /*1.4//, int ignore) */
{
	unsigned char c;
	int xpos = 0, ypos = 0, pass = 0;
	int v, i;
	LZW_STATIC_DATA sd;

	/* Initialize the Compression routines */
	if(!ReadOK(fd, &c, 1)) {
		return;
	}

	if(c > MAX_LWZ_BITS) {
		return;
	}

	/* Stash the color map into the image */
	for(i=0; (i < gdMaxColors); i++) {
		im->red[i] = cmap[CM_RED][i];
		im->green[i] = cmap[CM_GREEN][i];
		im->blue[i] = cmap[CM_BLUE][i];
		im->open[i] = 1;
	}

	/* Many (perhaps most) of these colors will remain marked open. */
	im->colorsTotal = gdMaxColors;
	if(LWZReadByte(fd, &sd, TRUE, c, ZeroDataBlockP) < 0) {
		return;
	}

	/*
	**  If this is an "uninteresting picture" ignore it.
	**  REMOVED For 1.4
	*/
	/*if (ignore) { */
	/*        while (LWZReadByte(fd, &sd, FALSE, c) >= 0) */
	/*                ; */
	/*        return; */
	/*} */

	while((v = LWZReadByte(fd, &sd, FALSE, c, ZeroDataBlockP)) >= 0 ) {
		if(v >= gdMaxColors) {
			v = 0;
		}

		/* This how we recognize which colors are actually used. */
		if(im->open[v]) {
			im->open[v] = 0;
		}

		gdImageSetPixel(im, xpos, ypos, v);

		++xpos;
		if(xpos == len) {
			xpos = 0;
			if(interlace) {
				switch (pass) {
				case 0:
				case 1:
					ypos += 8;
					break;
				case 2:
					ypos += 4;
					break;
				case 3:
					ypos += 2;
					break;
				}

				if(ypos >= height) {
					++pass;
					switch (pass) {
					case 1:
						ypos = 4;
						break;
					case 2:
						ypos = 2;
						break;
					case 3:
						ypos = 1;
						break;
					default:
						goto fini;
					}
				}
			} else {
				++ypos;
			}
		}

		if(ypos >= height) {
			break;
		}
	}

fini:
	if(LWZReadByte(fd, &sd, FALSE, c, ZeroDataBlockP) >=0) {
		/* Ignore extra */
	}
}